

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
          (TextureCubeGenMipmapCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *desc,deUint32 format,deUint32 dataType,deUint32 hint,int size)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeGenMipmapCase_02132b68;
  this->m_renderCtx = renderCtx;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_hint = hint;
  this->m_size = size;
  this->m_texture = (TextureCube *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,testCtx->m_log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  return;
}

Assistant:

TextureCubeGenMipmapCase::TextureCubeGenMipmapCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* desc, deUint32 format, deUint32 dataType, deUint32 hint, int size)
	: TestCase			(testCtx, name, desc)
	, m_renderCtx		(renderCtx)
	, m_format			(format)
	, m_dataType		(dataType)
	, m_hint			(hint)
	, m_size			(size)
	, m_texture			(DE_NULL)
	, m_renderer		(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
{
}